

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,BiggerExpr *ptr)

{
  Expr *pEVar1;
  BiggerExpr *pBVar2;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  BiggerExpr *local_18;
  BiggerExpr *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (BiggerExpr *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,">",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pBVar2 = local_18;
  pEVar1 = local_18->first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"left",&local_71);
  arrow(this,pBVar2,pEVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (**(local_18->first->super_Base)._vptr_Base)(local_18->first,this);
  pBVar2 = local_18;
  pEVar1 = local_18->second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"right",&local_99);
  arrow(this,pBVar2,pEVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  (**(local_18->second->super_Base)._vptr_Base)(local_18->second,this);
  return;
}

Assistant:

void gv_visitor::visit(BiggerExpr* ptr) {
    box(ptr, ">");
    arrow(ptr, ptr->first, "left");
    ptr->first->accept(this);
    arrow(ptr, ptr->second, "right");
    ptr->second->accept(this);
}